

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

bool __thiscall
sptk::reaper::EpochTracker::Init
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float min_f0_search,
          float max_f0_search,bool do_highpass,bool do_hilbert_transform)

{
  float *output;
  int16_t *input_00;
  ulong uVar1;
  EpochTracker *pEVar2;
  bool bVar3;
  ulong uVar4;
  
  bVar3 = false;
  if ((((input != (int16_t *)0x0) && (bVar3 = false, 6000.0 < sample_rate)) &&
      (bVar3 = false, 0.0 < min_f0_search)) &&
     ((sample_rate * 0.05 < (float)n_input && (min_f0_search < max_f0_search)))) {
    pEVar2 = this;
    CleanUp(this);
    this->min_f0_search_ = min_f0_search;
    this->max_f0_search_ = max_f0_search;
    this->sample_rate_ = sample_rate;
    input_00 = input;
    if (do_highpass) {
      input_00 = HighpassFilter(pEVar2,input,n_input,sample_rate,this->corner_frequency_,
                                this->filter_duration_);
    }
    pEVar2 = (EpochTracker *)&this->signal_;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)pEVar2,(long)n_input);
    output = (this->signal_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (do_hilbert_transform) {
      HilbertTransform(pEVar2,input_00,n_input,output);
    }
    else {
      uVar1 = 0;
      uVar4 = (ulong)(uint)n_input;
      if (n_input < 1) {
        uVar4 = uVar1;
      }
      for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
        output[uVar1] = (float)(int)input_00[uVar1];
      }
    }
    bVar3 = true;
    if (input_00 != input) {
      operator_delete__(input_00);
    }
  }
  return bVar3;
}

Assistant:

bool EpochTracker::Init(const int16_t* input, int32_t n_input, float sample_rate,
                        float min_f0_search, float max_f0_search,
                        bool do_highpass, bool do_hilbert_transform) {
#if 0
  if (input && (sample_rate > 6000.0) && (n_input > (sample_rate * 0.05)) &&
#else
  if (input && (sample_rate > kMinSampleRate) && (n_input > (sample_rate * 0.05)) &&
#endif
      (min_f0_search < max_f0_search) && (min_f0_search > 0.0)) {
    CleanUp();
    min_f0_search_ = min_f0_search;
    max_f0_search_ = max_f0_search;
    sample_rate_ = sample_rate;
    int16_t* input_p = const_cast<int16_t *>(input);
    if (do_highpass) {
      input_p = HighpassFilter(input_p, n_input, sample_rate,
                               corner_frequency_, filter_duration_);
    }
    signal_.resize(n_input);
    if (do_hilbert_transform) {
      HilbertTransform(input_p, n_input, &(signal_.front()));
    } else {
      for (int32_t i = 0; i < n_input; ++i) {
        signal_[i] = input_p[i];
      }
    }
    if (input_p != input) {
      delete [] input_p;
    }
    return true;
  }